

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractTestExample.cpp
# Opt level: O0

void __thiscall AbstractTestExample::UpdateDataInfo(AbstractTestExample *this)

{
  _Setprecision _Var1;
  ostream *poVar2;
  double testRate;
  AbstractTestExample *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"postive   ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->positiveN);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"negative  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->negtiveN);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"imbalance ");
  _Var1 = std::setprecision(4);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(double)this->negtiveN / (double)this->positiveN);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this->testN = (int)((double)this->instanceN * 0.2);
  this->trainN = this->instanceN - this->testN;
  this->posNtest = (int)((double)this->positiveN * 0.2);
  this->negNtest = this->testN - this->posNtest;
  this->posNtrain = this->positiveN - this->posNtest;
  this->negNtrain = this->negtiveN - this->negNtest;
  return;
}

Assistant:

void AbstractTestExample::UpdateDataInfo()
{
    std::cout<<"postive   "<<positiveN<<std::endl;
    std::cout<<"negative  "<<negtiveN<<std::endl;
    std::cout<<"imbalance "<<std::setprecision(4)<<static_cast<double>(negtiveN)/positiveN<<std::endl;
    
    double testRate=0.2;
    testN=instanceN*testRate;
    trainN=instanceN-testN;
    posNtest=positiveN*testRate;
    negNtest=testN-posNtest;
    posNtrain=positiveN-posNtest;
    negNtrain=negtiveN-negNtest;
}